

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

void __thiscall libtorrent::aux::socks5::hung_up(socks5 *this,error_code *e)

{
  bool bVar1;
  error_code local_20;
  
  this->m_active = false;
  local_20 = boost::asio::error::make_error_code(operation_aborted);
  bVar1 = boost::system::operator==(e,&local_20);
  if ((!bVar1) && (this->m_abort == false)) {
    if ((e->failed_ == true) && (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0)) {
      local_20.val_._0_1_ = 0xb;
      alert_manager::
      emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                (this->m_alerts,&this->m_proxy_addr,(operation_t *)&local_20,e);
    }
    retry_connection(this);
  }
  return;
}

Assistant:

void socks5::hung_up(error_code const& e)
{
	COMPLETE_ASYNC("socks5::hung_up");
	m_active = false;

	if (e == boost::asio::error::operation_aborted || m_abort) return;

	if (e && m_alerts.should_post<socks5_alert>())
		m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_read, e);

	retry_connection();
}